

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O1

void ANMS(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,int threshold)

{
  float fVar1;
  long lVar2;
  long lVar3;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_78;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *local_58;
  KeyPoint local_4c;
  
  local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = corners;
  if (0 < *(int *)(cNorm + 8)) {
    lVar3 = 0;
    do {
      if (0 < *(int *)(cNorm + 0xc)) {
        lVar2 = 0;
        do {
          fVar1 = *(float *)(**(long **)(cNorm + 0x48) * lVar3 + *(long *)(cNorm + 0x10) + lVar2 * 4
                            );
          if ((float)threshold < fVar1) {
            local_4c.pt.x = (float)(int)lVar2;
            local_4c.size = 3.0;
            local_4c.angle = -1.0;
            local_4c.octave = 0;
            local_4c.class_id = -1;
            local_4c.pt.y = (float)(int)lVar3;
            local_4c.response = fVar1;
            std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                      (&local_78,&local_4c);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < *(int *)(cNorm + 0xc));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)(cNorm + 8));
  }
  ANMS(&local_78,local_58);
  if (local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ANMS(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	vector<KeyPoint> keyPoint;

	for (int i = 0; i < cNorm.rows; ++i) {
		for (int j = 0; j < cNorm.cols; ++j) {
			float response = cNorm.at<float>(i, j);
			if (response <= threshold) continue;
			keyPoint.push_back(KeyPoint(Point(j, i), 3, -1.0F, response));
		}
	}

	ANMS(keyPoint, corners);
}